

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

string * Bipartition::toStringVerbose
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *edge,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *leaf2NumMap)

{
  bool bVar1;
  reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  string *in_RDI;
  reference rVar3;
  size_t i;
  size_t edge_size;
  string toDisplay;
  block_type in_stack_ffffffffffffff38;
  block_type *in_stack_ffffffffffffff40;
  allocator *end;
  size_t in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  reference local_70;
  ulong local_60;
  ulong local_58;
  allocator local_39;
  string local_38 [56];
  
  end = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",end);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  rVar3.m_mask = in_stack_ffffffffffffff38;
  rVar3.m_block = in_stack_ffffffffffffff40;
  local_60 = 0;
  while( true ) {
    if (local_58 <= local_60) break;
    rVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       rVar3.m_block,rVar3.m_mask);
    local_70 = rVar3;
    bVar1 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_70);
    if (bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RDX,local_60);
      std::__cxx11::string::operator+=(local_38,(string *)pvVar2);
      std::__cxx11::string::operator+=(local_38,",");
    }
    local_60 = local_60 + 1;
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,local_38);
  std::__cxx11::string::find_last_not_of((char)local_38,0x2c);
  Tools::substring(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(size_t)end);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

string Bipartition::toStringVerbose(boost::dynamic_bitset<> edge, vector<string> leaf2NumMap) {
    string toDisplay = "";
    size_t edge_size = edge.size();
    for (size_t i = 0; i < edge_size; i++) {
        if ((bool)edge[edge_size - i - 1]) {
            toDisplay += leaf2NumMap[i];
            toDisplay += ",";
        }
    }
    // remove the last ,
    return Tools::substring(toDisplay, 0, toDisplay.find_last_not_of(',')+1);
}